

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  Posf *pPVar4;
  Posf *pPVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Bytef *pBVar12;
  uInt uVar13;
  uint uVar14;
  bool bVar15;
  
LAB_00106650:
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar8 = s->lookahead;
      if (flush == 0 && uVar8 < 0x106) {
        return need_more;
      }
      if (uVar8 == 0) {
        uVar8 = s->strstart;
        uVar11 = 2;
        if (uVar8 < 2) {
          uVar11 = uVar8;
        }
        s->insert = uVar11;
        if (flush == 4) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar12 = (Bytef *)0x0;
          }
          else {
            pBVar12 = s->window + (uVar6 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar12,uVar8 - uVar6,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar12 = (Bytef *)0x0;
          }
          else {
            pBVar12 = s->window + (uVar6 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar12,uVar8 - uVar6,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (2 < uVar8) goto LAB_0010668e;
LAB_001066f1:
      uVar8 = s->match_length;
    }
    else {
LAB_0010668e:
      uVar8 = s->strstart;
      uVar11 = *(int *)(s->window + (uVar8 & 0xffff)) * 0x103d9 + 0x103d9U >> 0x10 & s->hash_mask;
      s->ins_h = uVar11;
      pPVar4 = s->head;
      uVar1 = pPVar4[uVar11];
      s->prev[s->w_mask & uVar8 & 0xffff] = uVar1;
      pPVar4[uVar11] = (Posf)uVar8;
      uVar11 = (uint)uVar1;
      if ((uVar11 == 0) || (s->w_size - 0x106 < uVar8 - uVar11)) goto LAB_001066f1;
      uVar8 = longest_match(s,uVar11);
      s->match_length = uVar8;
    }
    if (uVar8 < 3) {
      bVar7 = s->window[s->strstart];
      uVar8 = s->sym_next;
      s->d_buf[uVar8] = 0;
      s->sym_next = uVar8 + 1;
      s->l_buf[uVar8] = bVar7;
      s->dyn_ltree[bVar7].fc.freq = s->dyn_ltree[bVar7].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      uVar8 = s->strstart + 1;
      s->strstart = uVar8;
      if (s->sym_next != s->sym_end) goto LAB_00106650;
    }
    else {
      bVar7 = (char)uVar8 - 3;
      iVar9 = s->strstart - s->match_start;
      uVar8 = s->sym_next;
      s->d_buf[uVar8] = (ushf)iVar9;
      s->sym_next = uVar8 + 1;
      s->l_buf[uVar8] = bVar7;
      uVar10 = iVar9 - 1;
      s->dyn_ltree[(ulong)""[bVar7] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar7] + 0x101].fc.freq + 1;
      uVar11 = uVar10 & 0xffff;
      uVar8 = (uVar11 >> 7) + 0x100;
      if (uVar11 < 0x100) {
        uVar8 = uVar10;
      }
      s->dyn_dtree[""[uVar8 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar8 & 0xffff]].fc.freq + 1;
      uVar2 = s->sym_next;
      uVar3 = s->sym_end;
      uVar8 = s->match_length;
      uVar11 = s->lookahead - uVar8;
      s->lookahead = uVar11;
      if (uVar11 < 3 || s->max_lazy_match < uVar8) {
        uVar8 = uVar8 + s->strstart;
        s->strstart = uVar8;
        s->match_length = 0;
        if (s->chromium_zlib_hash == 0) {
          uVar11 = (uint)s->window[uVar8];
          s->ins_h = uVar11;
          s->ins_h = ((uint)s->window[uVar8 + 1] ^ uVar11 << ((byte)s->hash_shift & 0x1f)) &
                     s->hash_mask;
        }
      }
      else {
        s->match_length = uVar8 - 1;
        pBVar12 = s->window;
        uVar11 = s->hash_mask;
        pPVar4 = s->head;
        pPVar5 = s->prev;
        uVar10 = s->w_mask;
        uVar13 = uVar8 - 2;
        uVar8 = s->strstart + 1;
        do {
          s->strstart = uVar8;
          uVar14 = *(int *)(pBVar12 + (uVar8 & 0xffff)) * 0x103d9 + 0x103d9U >> 0x10 & uVar11;
          s->ins_h = uVar14;
          pPVar5[uVar8 & 0xffff & uVar10] = pPVar4[uVar14];
          pPVar4[uVar14] = (Posf)uVar8;
          s->match_length = uVar13;
          uVar8 = uVar8 + 1;
          bVar15 = uVar13 != 0;
          uVar13 = uVar13 - 1;
        } while (bVar15);
        s->strstart = uVar8;
      }
      if (uVar2 != uVar3) goto LAB_00106650;
    }
    uVar6 = s->block_start;
    if ((long)uVar6 < 0) {
      pBVar12 = (Bytef *)0x0;
    }
    else {
      pBVar12 = s->window + (uVar6 & 0xffffffff);
    }
    _tr_flush_block(s,(charf *)pBVar12,uVar8 - uVar6,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(deflate_state *s, int flush) {
    IPos hash_head;       /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart + 2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            hash_head = insert_string(s, s->strstart);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    hash_head = insert_string(s, s->strstart);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;

                if (!s->chromium_zlib_hash) {
                  s->ins_h = s->window[s->strstart];
                  UPDATE_HASH(s, s->ins_h, s->window[s->strstart + 1]);
#if MIN_MATCH != 3
                  Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                  /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                   * matter since it will be recomputed at next deflate call.
                   */
                }
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit(s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}